

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_witness_p2wpkh_from_der
              (uchar *pub_key,size_t pub_key_len,uchar *sig,size_t sig_len,
              wally_tx_witness_stack **witness)

{
  int local_d4;
  size_t sStack_d0;
  int ret;
  size_t written;
  uchar scriptsig [140];
  wally_tx_witness_stack **witness_local;
  size_t sig_len_local;
  uchar *sig_local;
  size_t pub_key_len_local;
  uchar *pub_key_local;
  
  local_d4 = wally_scriptsig_p2pkh_from_der
                       (pub_key,pub_key_len,sig,sig_len,(uchar *)&written,0x8c,
                        &stack0xffffffffffffff30);
  if (local_d4 == 0) {
    local_d4 = scriptsig_to_witness((uchar *)&written,sStack_d0,witness);
  }
  return local_d4;
}

Assistant:

int wally_witness_p2wpkh_from_der(
    const unsigned char *pub_key,
    size_t pub_key_len,
    const unsigned char *sig,
    size_t sig_len,
    struct wally_tx_witness_stack **witness)
{
    unsigned char scriptsig[WALLY_SCRIPTSIG_P2PKH_MAX_LEN];
    size_t written;
    int ret;

    ret = wally_scriptsig_p2pkh_from_der(pub_key, pub_key_len, sig, sig_len, scriptsig, sizeof(scriptsig), &written);

    if (ret == WALLY_OK)
        ret = scriptsig_to_witness(scriptsig, written, witness);

    return ret;
}